

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O1

Result<wallet::SelectionResult> *
wallet::SelectCoinsSRD
          (Result<wallet::SelectionResult> *__return_storage_ptr__,
          vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *utxo_pool,
          CAmount target_value,CAmount change_fee,FastRandomContext *rng,int max_selection_weight)

{
  _Base_ptr p_Var1;
  int iVar2;
  pointer pOVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  ulong uVar10;
  long lVar11;
  size_t *psVar12;
  undefined8 uVar13;
  ulong uVar14;
  int iVar15;
  value_type *__x;
  long lVar16;
  long in_FS_OFFSET;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> indexes;
  priority_queue<wallet::OutputGroup,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>,_wallet::MinOutputGroupComparator>
  heap;
  ulong *local_1d0;
  undefined1 local_198 [16];
  pointer local_188;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  local_138 [8];
  _Rb_tree_node_base local_130;
  size_t local_110;
  CAmount local_108;
  undefined8 uStack_100;
  _Storage<long,_true> local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  size_t sStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  priority_queue<wallet::OutputGroup,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>,_wallet::MinOutputGroupComparator>
  local_c8;
  SelectionResult local_a8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.m_algo = SRD;
  local_a8.m_use_effective = false;
  local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  local_a8.m_algo_completed = true;
  local_a8.m_weight = 0;
  local_a8.bump_fee_group_discount = 0;
  local_c8.c.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.c.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.c.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188 = (pointer)0x0;
  local_198 = (undefined1  [16])0x0;
  local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8.m_target = target_value;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,
             ((long)(utxo_pool->
                    super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(utxo_pool->
                    super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5);
  auVar5 = _DAT_008110a0;
  if (local_198._0_8_ != local_198._8_8_) {
    uVar10 = local_198._8_8_ + (-8 - local_198._0_8_);
    auVar20._8_4_ = (int)uVar10;
    auVar20._0_8_ = uVar10;
    auVar20._12_4_ = (int)(uVar10 >> 0x20);
    auVar18._0_8_ = uVar10 >> 3;
    auVar18._8_8_ = auVar20._8_8_ >> 3;
    uVar14 = 0;
    auVar18 = auVar18 ^ _DAT_008110a0;
    auVar19 = _DAT_00811090;
    do {
      auVar20 = auVar19 ^ auVar5;
      if ((bool)(~(auVar20._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar20._0_4_ ||
                  auVar18._4_4_ < auVar20._4_4_) & 1)) {
        *(ulong *)(local_198._0_8_ + uVar14 * 8) = uVar14;
      }
      if ((auVar20._12_4_ != auVar18._12_4_ || auVar20._8_4_ <= auVar18._8_4_) &&
          auVar20._12_4_ <= auVar18._12_4_) {
        *(ulong *)(local_198._0_8_ + (uVar14 + 1) * 8) = uVar14 + 1;
      }
      uVar14 = uVar14 + 2;
      lVar11 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 2;
      auVar19._8_8_ = lVar11 + 2;
    } while (((uVar10 >> 3) + 2 & 0xfffffffffffffffe) != uVar14);
  }
  std::
  shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,FastRandomContext&>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_198._0_8_,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_198._8_8_,rng);
  uVar13 = local_198._8_8_;
  iVar15 = 0;
  local_1d0 = (ulong *)local_198._0_8_;
  bVar17 = local_198._0_8_ == local_198._8_8_;
  if (bVar17) {
    bVar9 = false;
  }
  else {
    lVar11 = target_value + change_fee + 50000;
    p_Var1 = (_Base_ptr)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8);
    lVar16 = 0;
    bVar9 = false;
    do {
      uVar10 = *local_1d0;
      pOVar3 = (utxo_pool->
               super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar14 = ((long)(utxo_pool->
                      super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>)
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar3 >> 3) *
               0x4ec4ec4ec4ec4ec5;
      if (uVar14 < uVar10 || uVar14 - uVar10 == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          uVar13 = std::__throw_out_of_range_fmt
                             (
                             "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             );
          if ((pointer)local_198._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_198._0_8_,(long)local_188 - local_198._0_8_);
          }
          std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::~vector
                    (&local_c8.c);
          _GLOBAL__N_1::std::
          _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                       *)&local_a8);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            _Unwind_Resume(uVar13);
          }
        }
        goto LAB_00587449;
      }
      __x = pOVar3 + uVar10;
      std::
      priority_queue<wallet::OutputGroup,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>,_wallet::MinOutputGroupComparator>
      ::push(&local_c8,__x);
      lVar16 = lVar16 + *(long *)((long)&__x->m_value +
                                 (ulong)((__x->m_subtract_fee_outputs ^ 1) << 5));
      iVar15 = iVar15 + __x->m_weight;
      do {
        if (iVar15 <= max_selection_weight) break;
        lVar4 = *(long *)((long)&(local_c8.c.
                                  super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_value +
                         (ulong)(((local_c8.c.
                                   super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                  m_subtract_fee_outputs ^ 1) << 5));
        iVar2 = (local_c8.c.
                 super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                 _M_impl.super__Vector_impl_data._M_start)->m_weight;
        std::
        priority_queue<wallet::OutputGroup,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>,_wallet::MinOutputGroupComparator>
        ::pop(&local_c8);
        iVar15 = iVar15 - iVar2;
        lVar16 = lVar16 - lVar4;
        bVar9 = true;
      } while (local_c8.c.
               super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl
               .super__Vector_impl_data._M_start !=
               local_c8.c.
               super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl
               .super__Vector_impl_data._M_finish);
      if (lVar11 <= lVar16) {
        while( true ) {
          pOVar3 = local_c8.c.
                   super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (local_c8.c.
              super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
              super__Vector_impl_data._M_start ==
              local_c8.c.
              super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
              super__Vector_impl_data._M_finish) break;
          SelectionResult::
          InsertInputs<std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
                    (&local_a8,
                     &(local_c8.c.
                       super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_outputs);
          local_a8.m_use_effective = (bool)(pOVar3->m_subtract_fee_outputs ^ 1);
          local_a8.m_weight = local_a8.m_weight + pOVar3->m_weight;
          std::
          priority_queue<wallet::OutputGroup,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>,_wallet::MinOutputGroupComparator>
          ::pop(&local_c8);
        }
        if (local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
            (_Base_ptr)0x0) {
          local_130._M_color = _S_red;
          local_130._M_parent = (_Base_ptr)0x0;
          local_130._M_left = &local_130;
          psVar12 = &local_110;
          local_130._M_right = local_130._M_left;
        }
        else {
          local_130._M_color =
               local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
          local_130._M_parent =
               local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          local_130._M_left =
               local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_130._M_right =
               local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
          (local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
          _M_parent = &local_130;
          local_110 = local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count;
          local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header;
          psVar12 = &local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count;
          local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        }
        *psVar12 = 0;
        uStack_100 = CONCAT62(local_a8._58_6_,CONCAT11(local_a8.m_use_effective,local_a8.m_algo));
        uStack_f0 = CONCAT71(local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                             super__Optional_payload_base<long>._9_7_,
                             local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                             super__Optional_payload_base<long>._M_engaged);
        local_e8 = CONCAT71(local_a8._81_7_,local_a8.m_algo_completed);
        local_d8 = CONCAT44(local_a8._100_4_,local_a8.m_weight);
        uStack_d0 = local_a8.bump_fee_group_discount;
        sStack_e0 = local_a8.m_selections_evaluated;
        local_f8 = local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                   super__Optional_payload_base<long>._M_payload;
        local_108 = local_a8.m_target;
        if (local_130._M_parent == (_Base_ptr)0x0) {
          *(undefined4 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) = 0;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) = 0;
          *(_Base_ptr *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) =
               p_Var1;
          *(_Base_ptr *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
               p_Var1;
          psVar12 = (size_t *)
                    ((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                            super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                            super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                            super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                            super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                            super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> +
                    0x28);
        }
        else {
          *(_Rb_tree_color *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) =
               local_130._M_color;
          *(_Base_ptr *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) =
               local_130._M_parent;
          *(_Base_ptr *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) =
               local_130._M_left;
          *(_Base_ptr *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
               local_130._M_right;
          (local_130._M_parent)->_M_parent = p_Var1;
          *(size_t *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) =
               local_110;
          local_130._M_parent = (_Base_ptr)0x0;
          psVar12 = &local_110;
          local_130._M_left = &local_130;
          local_130._M_right = &local_130;
        }
        *psVar12 = 0;
        auVar5._8_8_ = uStack_f0;
        auVar5._0_8_ = local_f8._M_value;
        auVar6._8_8_ = sStack_e0;
        auVar6._0_8_ = local_e8;
        *(undefined4 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x60) =
             (undefined4)local_d8;
        *(undefined4 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 100) =
             local_d8._4_4_;
        *(undefined4 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x68) =
             (undefined4)uStack_d0;
        *(undefined4 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x6c) =
             uStack_d0._4_4_;
        *(undefined1 (*) [16])
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x50) =
             auVar6;
        *(undefined1 (*) [16])
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x40) =
             auVar5;
        *(CAmount *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30) =
             local_108;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) =
             uStack_100;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) =
             '\x01';
        _GLOBAL__N_1::std::
        _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
        ::~_Rb_tree(local_138);
        if (lVar11 <= lVar16) break;
      }
      local_1d0 = local_1d0 + 1;
      bVar17 = local_1d0 == (ulong *)uVar13;
    } while (!bVar17);
  }
  if (bVar17) {
    if (bVar9) {
      ErrorMaxWeightExceeded();
    }
    else {
      local_168._1_15_ = SUB1615((undefined1  [16])0x0,1);
      local_148._1_15_ = SUB1615((undefined1  [16])0x0,1);
      *(undefined1 **)
       &(__return_storage_ptr__->m_variant).
        super__Variant_base<bilingual_str,_wallet::SelectionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> =
           (undefined1 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10);
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x11) = 0;
      *(undefined4 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x19) = 0;
      *(undefined2 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x1d) = 0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x1f) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) = 0;
      local_178._8_8_ = 0;
      local_178._0_8_ = local_168;
      auVar7[0xf] = 0;
      auVar7._0_15_ = local_168._1_15_;
      local_168 = auVar7 << 8;
      *(undefined1 **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
           (undefined1 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) = 0;
      local_158._8_8_ = 0;
      local_158._0_8_ = local_148;
      auVar8[0xf] = 0;
      auVar8._0_15_ = local_148._1_15_;
      local_148 = auVar8 << 8;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) = '\0';
    }
  }
  if ((pointer)local_198._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_198._0_8_,(long)local_188 - local_198._0_8_);
  }
  std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::~vector(&local_c8.c);
  _GLOBAL__N_1::std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00587449:
  __stack_chk_fail();
}

Assistant:

util::Result<SelectionResult> SelectCoinsSRD(const std::vector<OutputGroup>& utxo_pool, CAmount target_value, CAmount change_fee, FastRandomContext& rng,
                                             int max_selection_weight)
{
    SelectionResult result(target_value, SelectionAlgorithm::SRD);
    std::priority_queue<OutputGroup, std::vector<OutputGroup>, MinOutputGroupComparator> heap;

    // Include change for SRD as we want to avoid making really small change if the selection just
    // barely meets the target. Just use the lower bound change target instead of the randomly
    // generated one, since SRD will result in a random change amount anyway; avoid making the
    // target needlessly large.
    target_value += CHANGE_LOWER + change_fee;

    std::vector<size_t> indexes;
    indexes.resize(utxo_pool.size());
    std::iota(indexes.begin(), indexes.end(), 0);
    std::shuffle(indexes.begin(), indexes.end(), rng);

    CAmount selected_eff_value = 0;
    int weight = 0;
    bool max_tx_weight_exceeded = false;
    for (const size_t i : indexes) {
        const OutputGroup& group = utxo_pool.at(i);
        Assume(group.GetSelectionAmount() > 0);

        // Add group to selection
        heap.push(group);
        selected_eff_value += group.GetSelectionAmount();
        weight += group.m_weight;

        // If the selection weight exceeds the maximum allowed size, remove the least valuable inputs until we
        // are below max weight.
        if (weight > max_selection_weight) {
            max_tx_weight_exceeded = true; // mark it in case we don't find any useful result.
            do {
                const OutputGroup& to_remove_group = heap.top();
                selected_eff_value -= to_remove_group.GetSelectionAmount();
                weight -= to_remove_group.m_weight;
                heap.pop();
            } while (!heap.empty() && weight > max_selection_weight);
        }

        // Now check if we are above the target
        if (selected_eff_value >= target_value) {
            // Result found, add it.
            while (!heap.empty()) {
                result.AddInput(heap.top());
                heap.pop();
            }
            return result;
        }
    }
    return max_tx_weight_exceeded ? ErrorMaxWeightExceeded() : util::Error();
}